

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_http.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
* __thiscall
SimpleWeb::
ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>::
parse_host_port(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
                *__return_storage_ptr__,
               ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
               *this,string *host_port,unsigned_short default_port)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_short local_92 [4];
  char local_89;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_88;
  char chr;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  int square_count;
  bool parse_port;
  string port;
  string host;
  unsigned_short default_port_local;
  string *host_port_local;
  ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>_>
  *this_local;
  
  host.field_2._14_2_ = default_port;
  std::__cxx11::string::string((string *)(port.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&square_count);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)(port.field_2._M_local_buf + 8));
  bVar1 = false;
  __range2._0_4_ = 0;
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_88._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff78), bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    local_89 = *pcVar3;
    if (local_89 == '[') {
      __range2._0_4_ = (int)__range2 + 1;
    }
    else if (local_89 == ']') {
      __range2._0_4_ = (int)__range2 + -1;
    }
    else if (((int)__range2 == 0) && (local_89 == ':')) {
      bVar1 = true;
    }
    else if (bVar1) {
      std::__cxx11::string::operator+=((string *)&square_count,local_89);
    }
    else {
      std::__cxx11::string::operator+=((string *)(port.field_2._M_local_buf + 8),local_89);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    uVar5 = std::__cxx11::stoul((string *)&square_count,(size_t *)0x0,10);
    local_92[0] = (unsigned_short)uVar5;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&port.field_2 + 8),local_92);
  }
  else {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short_&,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&port.field_2 + 8),(unsigned_short *)(host.field_2._M_local_buf + 0xe));
  }
  local_92[1] = 1;
  local_92[2] = 0;
  std::__cxx11::string::~string((string *)&square_count);
  std::__cxx11::string::~string((string *)(port.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, unsigned short> parse_host_port(const std::string &host_port, unsigned short default_port) const noexcept {
      std::string host, port;
      host.reserve(host_port.size());
      bool parse_port = false;
      int square_count = 0; // To parse IPv6 addresses
      for(auto chr : host_port) {
        if(chr == '[')
          ++square_count;
        else if(chr == ']')
          --square_count;
        else if(square_count == 0 && chr == ':')
          parse_port = true;
        else if(!parse_port)
          host += chr;
        else
          port += chr;
      }

      if(port.empty())
        return {std::move(host), default_port};
      else {
        try {
          return {std::move(host), static_cast<unsigned short>(std::stoul(port))};
        }
        catch(...) {
          return {std::move(host), default_port};
        }
      }
    }